

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

iterator * __thiscall
ft::setBase<int,_ft::less<int>,_ft::allocator<int>_>::upper_bound
          (iterator *__return_storage_ptr__,setBase<int,_ft::less<int>,_ft::allocator<int>_> *this,
          key_type *k)

{
  key_type *x;
  bool bVar1;
  reference y;
  less<int> local_51;
  int local_50;
  iterator local_40;
  byte local_21;
  key_type *local_20;
  key_type *k_local;
  setBase<int,_ft::less<int>,_ft::allocator<int>_> *this_local;
  iterator *it;
  
  local_21 = 0;
  local_20 = k;
  k_local = (key_type *)this;
  this_local = (setBase<int,_ft::less<int>,_ft::allocator<int>_> *)__return_storage_ptr__;
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::begin
            (__return_storage_ptr__,
             &this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>);
  do {
    treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::end
              (&local_40,&this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>);
    bVar1 = operator!=(__return_storage_ptr__,&local_40);
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator(&local_40);
    if (!bVar1) {
      local_50 = 2;
LAB_00108fb4:
      if ((local_21 & 1) == 0) {
        treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator(__return_storage_ptr__)
        ;
      }
      if (local_50 != 1) {
        treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::end
                  (__return_storage_ptr__,
                   &this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>);
      }
      return __return_storage_ptr__;
    }
    key_comp(this);
    x = local_20;
    y = treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*(__return_storage_ptr__);
    bVar1 = less<int>::operator()(&local_51,x,y);
    if (bVar1) {
      local_21 = 1;
      local_50 = 1;
      goto LAB_00108fb4;
    }
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++(__return_storage_ptr__);
  } while( true );
}

Assistant:

iterator		upper_bound(key_type const & k)
	{
		for (iterator it = this->begin(); it != this->end(); ++it)
		{
			if (this->key_comp()(k, *it)) return it;
		}
		return this->end();
	}